

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall
Application::rejectOrder
          (Application *this,SenderCompID *sender,TargetCompID *target,ClOrdID *clOrdID,
          Symbol *symbol,Side *side,string *message)

{
  string *psVar1;
  SessionNotFound *anon_var_0;
  string local_5c0 [32];
  Text local_5a0;
  PRICE local_548;
  AvgPx local_540;
  QTY local_4e8;
  CumQty local_4e0;
  QTY local_488;
  LeavesQty local_480;
  OrdStatus local_428;
  ExecType local_3d0;
  ExecTransType local_378;
  string local_320;
  ExecID local_300;
  OrderID local_2a8;
  undefined1 local_250 [8];
  ExecutionReport fixOrder;
  undefined1 local_e8 [8];
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  Side *side_local;
  Symbol *symbol_local;
  ClOrdID *clOrdID_local;
  TargetCompID *target_local;
  SenderCompID *sender_local;
  Application *this_local;
  
  psVar1 = FIX::StringField::getValue_abi_cxx11_(&sender->super_StringField);
  FIX::TargetCompID::TargetCompID
            ((TargetCompID *)&senderCompID.super_StringField.super_FieldBase.m_metrics,psVar1);
  psVar1 = FIX::StringField::getValue_abi_cxx11_(&target->super_StringField);
  FIX::SenderCompID::SenderCompID((SenderCompID *)local_e8,psVar1);
  psVar1 = FIX::StringField::getValue_abi_cxx11_(&clOrdID->super_StringField);
  FIX::OrderID::OrderID(&local_2a8,psVar1);
  IDGenerator::genExecutionID_abi_cxx11_(&local_320,&this->m_generator);
  FIX::ExecID::ExecID(&local_300,&local_320);
  FIX::ExecTransType::ExecTransType(&local_378,"0812211Application");
  FIX::ExecType::ExecType(&local_3d0,"812211Application");
  FIX::OrdStatus::OrdStatus(&local_428,"812211Application");
  local_488 = 0.0;
  FIX::LeavesQty::LeavesQty(&local_480,&local_488);
  local_4e8 = 0.0;
  FIX::CumQty::CumQty(&local_4e0,&local_4e8);
  local_548 = 0.0;
  FIX::AvgPx::AvgPx(&local_540,&local_548);
  FIX42::ExecutionReport::ExecutionReport
            ((ExecutionReport *)local_250,&local_2a8,&local_300,&local_378,&local_3d0,&local_428,
             symbol,side,&local_480,&local_4e0,&local_540);
  FIX::AvgPx::~AvgPx(&local_540);
  FIX::CumQty::~CumQty(&local_4e0);
  FIX::LeavesQty::~LeavesQty(&local_480);
  FIX::OrdStatus::~OrdStatus(&local_428);
  FIX::ExecType::~ExecType(&local_3d0);
  FIX::ExecTransType::~ExecTransType(&local_378);
  FIX::ExecID::~ExecID(&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  FIX::OrderID::~OrderID(&local_2a8);
  FIX42::ExecutionReport::set((ExecutionReport *)local_250,clOrdID);
  FIX::Text::Text(&local_5a0,message);
  FIX42::ExecutionReport::set((ExecutionReport *)local_250,&local_5a0);
  FIX::Text::~Text(&local_5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,"",(allocator<char> *)((long)&anon_var_0 + 7));
  FIX::Session::sendToTarget
            ((Message *)local_250,(SenderCompID *)local_e8,
             (TargetCompID *)&senderCompID.super_StringField.super_FieldBase.m_metrics,local_5c0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
  FIX42::ExecutionReport::~ExecutionReport((ExecutionReport *)local_250);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)local_e8);
  FIX::TargetCompID::~TargetCompID
            ((TargetCompID *)&senderCompID.super_StringField.super_FieldBase.m_metrics);
  return;
}

Assistant:

void Application::rejectOrder(
    const FIX::SenderCompID &sender,
    const FIX::TargetCompID &target,
    const FIX::ClOrdID &clOrdID,
    const FIX::Symbol &symbol,
    const FIX::Side &side,
    const std::string &message) {
  FIX::TargetCompID targetCompID(sender.getValue());
  FIX::SenderCompID senderCompID(target.getValue());

  FIX42::ExecutionReport fixOrder(
      FIX::OrderID(clOrdID.getValue()),
      FIX::ExecID(m_generator.genExecutionID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(FIX::ExecType_REJECTED),
      FIX::OrdStatus(FIX::ExecType_REJECTED),
      symbol,
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(0),
      FIX::AvgPx(0));

  fixOrder.set(clOrdID);
  fixOrder.set(FIX::Text(message));

  try {
    FIX::Session::sendToTarget(fixOrder, senderCompID, targetCompID);
  } catch (FIX::SessionNotFound &) {}
}